

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O0

void __thiscall
unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
decrease_memory_use(olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this
                   ,size_t delta)

{
  size_t delta_local;
  olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this_local;
  memory_order __b;
  
  if (delta == 0) {
    __assert_fail("delta > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                  ,0xa8c,
                  "void unodb::olc_db<unsigned long, std::span<const std::byte>>::decrease_memory_use(std::size_t) [Key = unsigned long, Value = std::span<const std::byte>]"
                 );
  }
  std::operator&(memory_order_relaxed,__memory_order_mask);
  if ((this->current_memory_use).super___atomic_base<unsigned_long>._M_i < delta) {
    __assert_fail("delta <= current_memory_use.load(std::memory_order_relaxed)",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                  ,0xa8e,
                  "void unodb::olc_db<unsigned long, std::span<const std::byte>>::decrease_memory_use(std::size_t) [Key = unsigned long, Value = std::span<const std::byte>]"
                 );
  }
  LOCK();
  (this->current_memory_use).super___atomic_base<unsigned_long>._M_i =
       (this->current_memory_use).super___atomic_base<unsigned_long>._M_i - delta;
  UNLOCK();
  return;
}

Assistant:

void olc_db<Key, Value>::decrease_memory_use(std::size_t delta) noexcept {
  UNODB_DETAIL_ASSERT(delta > 0);
  UNODB_DETAIL_ASSERT(delta <=
                      current_memory_use.load(std::memory_order_relaxed));

  current_memory_use.fetch_sub(delta, std::memory_order_relaxed);
}